

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

u8 gb_read_ext_ram(Emulator *e,MaskedAddress addr)

{
  MaskedAddress addr_local;
  Emulator *e_local;
  
  if ((e->state).memory_map_state.ext_ram_enabled == FALSE) {
    e_local._7_1_ = 0xff;
  }
  else {
    if (0x1fff < addr) {
      __assert_fail("addr <= ADDR_MASK_8K",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x4d1,"u8 gb_read_ext_ram(Emulator *, MaskedAddress)");
    }
    e_local._7_1_ = (e->state).ext_ram.data[(e->state).memory_map_state.ext_ram_base | (uint)addr];
  }
  return e_local._7_1_;
}

Assistant:

static u8 gb_read_ext_ram(Emulator* e, MaskedAddress addr) {
  if (MMAP_STATE.ext_ram_enabled) {
    assert(addr <= ADDR_MASK_8K);
    return EXT_RAM.data[MMAP_STATE.ext_ram_base | addr];
  } else {
    HOOK(read_ram_disabled_a, addr);
    return INVALID_READ_BYTE;
  }
}